

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexEs5TestImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input)

{
  RegexPattern *this;
  undefined8 *puVar1;
  code *pcVar2;
  undefined1 isSticky;
  undefined8 uVar3;
  Program *pStrongReference;
  ScriptContext *scriptContext_00;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  BOOLEAN BVar8;
  bool bVar9;
  undefined4 *puVar10;
  Recycler *pRVar11;
  RecyclerWeakReference<Js::JavascriptString> *pRVar12;
  JavascriptBoolean *pJVar13;
  CharCount inputLength;
  ulong uVar14;
  GroupInfo GVar15;
  int iVar16;
  undefined8 unaff_R12;
  Type TVar17;
  ulong uVar18;
  byte bVar19;
  undefined4 uVar20;
  Type cachedValue;
  undefined1 local_90 [32];
  Type local_70;
  uint local_54;
  Type TStack_50;
  CharCount offset;
  JavascriptRegExp *local_48;
  ScriptContext *local_40;
  uint local_38;
  uint local_34;
  
  this = (regularExpression->pattern).ptr;
  local_48 = regularExpression;
  local_90._16_8_ = JavascriptString::GetString(input);
  local_90._24_4_ = JavascriptString::GetLength(input);
  bVar5 = UnifiedRegex::RegexPattern::IsGlobal(this);
  bVar6 = UnifiedRegex::RegexPattern::IsSticky(this);
  local_38 = CONCAT31(local_38._1_3_,bVar5);
  local_70._0_1_ = bVar6;
  local_90._8_8_ = this;
  local_40 = scriptContext;
  if (bVar5 || bVar6) {
    TVar17.ptr = (Matcher *)0x0;
    local_34 = 0;
    cachedValue.ptr = (Program *)0x0;
    local_70.unified.trigramInfo.ptr = (Type)(TrigramInfo *)0x0;
  }
  else {
    UnifiedRegex::RegexPattern::EnsureTestCache((RegexPattern *)local_90);
    local_34 = UnifiedRegex::RegexPattern::GetTestCacheIndex(input);
    local_70.unified.trigramInfo.ptr = (Type)(Type)local_90._0_8_;
    puVar1 = (undefined8 *)
             ((BVStatic<8UL> *)(local_90._0_8_ + ((ulong)local_34 + 1) * 8))->data[0].word;
    if (puVar1 == (undefined8 *)0x0) {
      cachedValue.ptr = (Program *)0x0;
    }
    else {
      cachedValue.ptr = (Program *)*puVar1;
    }
    TVar17.ptr = (Matcher *)
                 CONCAT71((int7)((ulong)unaff_R12 >> 8),cachedValue.ptr == (Program *)input);
  }
  RegexHelperTrace(local_40,Test,local_48,input);
  inputLength = (CharCount)(bVar5 || bVar6);
  local_70.unified.matcher.ptr = (Type)TVar17.ptr;
  TStack_50.ptr = (Program *)input;
  UnifiedRegex::RegexPattern::TraceTestCache
            (SUB81(TVar17.ptr,0),input,(JavascriptString *)cachedValue.ptr,bVar5 || bVar6);
  if (SUB81(TVar17.ptr,0) == false) {
LAB_00bdd942:
    uVar20 = 0;
  }
  else {
    if (bVar5 || bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      inputLength = 0xfc470b;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x2c2,"(useCache)","useCache");
      if (!bVar7) goto LAB_00bddce1;
      *puVar10 = 0;
    }
    BVar8 = BVStatic<8UL>::Test((BVStatic<8UL> *)local_70.unified.trigramInfo.ptr,local_34);
    if (BVar8 == '\0') goto LAB_00bdd942;
    inputLength = 0;
    InvalidateLastMatchOnCtor(local_40,local_48,(JavascriptString *)TStack_50.ptr,false);
    uVar20 = (undefined4)CONCAT71((int7)((ulong)cachedValue.ptr >> 8),1);
  }
  bVar7 = local_38._0_1_;
  isSticky = local_70._0_1_;
  bVar9 = GetInitialOffset(local_38._0_1_,(bool)local_70._0_1_,local_48,inputLength,&local_54);
  scriptContext_00 = local_40;
  pStrongReference = TStack_50.ptr;
  if (bVar9) {
    local_38 = local_54;
    local_90._28_4_ = uVar20;
    local_70.unified.program.ptr = (Type)cachedValue.ptr;
    if ((uint)local_90._24_4_ < local_54) {
      uVar18 = 0xffffffffffffffff;
      uVar14 = 0;
    }
    else {
      GVar15 = SimpleMatch(local_40,(RegexPattern *)local_90._8_8_,(char16 *)local_90._16_8_,
                           local_90._24_4_,local_54);
      uVar14 = (ulong)GVar15 & 0xffffffff;
      uVar18 = (ulong)GVar15 >> 0x20;
    }
    GVar15 = (GroupInfo)(uVar18 << 0x20 | uVar14);
    PropagateLastMatch(scriptContext_00,bVar7,(bool)isSticky,local_48,
                       (JavascriptString *)TStack_50.ptr,GVar15,GVar15,true,true,false);
    uVar3 = local_70.unified.matcher.ptr;
    iVar16 = (int)uVar18;
    if (!bVar5 && !bVar6) {
      if (local_38 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2ea,"(offset == 0)","offset == 0");
        if (!bVar5) goto LAB_00bddce1;
        *puVar10 = 0;
      }
      bVar19 = (byte)uVar3 ^ 1;
      if (local_70.unified.program.ptr != (Type)TStack_50.ptr && bVar19 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2eb,"(!cacheHit || cachedInput == input)",
                                    "!cacheHit || cachedInput == input");
        if (!bVar5) goto LAB_00bddce1;
        *puVar10 = 0;
      }
      if ((bool)(char)local_90._28_4_ == (iVar16 == -1) && bVar19 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2ec,"(!cacheHit || cachedResult == wasFound)",
                                    "!cacheHit || cachedResult == wasFound");
        if (!bVar5) {
LAB_00bddce1:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar10 = 0;
      }
      pRVar11 = RecyclableObject::GetRecycler((RecyclableObject *)local_48);
      pRVar12 = Memory::Recycler::CreateWeakReferenceHandle<Js::JavascriptString>
                          (pRVar11,(JavascriptString *)TStack_50.ptr);
      uVar4 = local_34;
      uVar3 = local_70.unified.trigramInfo.ptr;
      Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_>::WriteBarrierSet
                ((WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_> *)
                 ((BVStatic<8UL> *)((long)local_70.unified.trigramInfo.ptr + (ulong)local_34 * 8) +
                 1),pRVar12);
      if (iVar16 == -1) {
        BVStatic<8UL>::Clear((BVStatic<8UL> *)uVar3,uVar4);
      }
      else {
        BVStatic<8UL>::Set((BVStatic<8UL> *)uVar3,uVar4);
      }
    }
    pJVar13 = (JavascriptBoolean *)JavascriptBoolean::ToVar((uint)(iVar16 != -1),local_40);
  }
  else {
    if (!bVar5 && !bVar6) {
      if (local_54 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2d7,"(offset == 0)","offset == 0");
        if (!bVar5) goto LAB_00bddce1;
        *puVar10 = 0;
      }
      if (local_70._8_1_ == '\x01' && cachedValue.ptr != pStrongReference) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2d8,"(!cacheHit || cachedInput == input)",
                                    "!cacheHit || cachedInput == input");
        if (!bVar5) goto LAB_00bddce1;
        *puVar10 = 0;
      }
      if ((byte)(local_70._8_1_ & (byte)uVar20) == 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x2d9,"(!cacheHit || cachedResult == false)",
                                    "!cacheHit || cachedResult == false");
        if (!bVar5) goto LAB_00bddce1;
        *puVar10 = 0;
      }
      pRVar11 = RecyclableObject::GetRecycler((RecyclableObject *)local_48);
      pRVar12 = Memory::Recycler::CreateWeakReferenceHandle<Js::JavascriptString>
                          (pRVar11,(JavascriptString *)pStrongReference);
      uVar4 = local_34;
      uVar3 = local_70.unified.trigramInfo.ptr;
      Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_>::WriteBarrierSet
                ((WriteBarrierPtr<Memory::RecyclerWeakReference<Js::JavascriptString>_> *)
                 ((BVStatic<8UL> *)((long)local_70.unified.trigramInfo.ptr + (ulong)local_34 * 8) +
                 1),pRVar12);
      BVStatic<8UL>::Clear((BVStatic<8UL> *)uVar3,uVar4);
    }
    pJVar13 = (((scriptContext_00->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).booleanFalse.ptr;
  }
  return pJVar13;
}

Assistant:

Var RegexHelper::RegexEs5TestImpl(ScriptContext* scriptContext, JavascriptRegExp *regularExpression, JavascriptString *input)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();
        UnifiedRegex::GroupInfo match; // initially undefined

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        const bool useCache = !isGlobal && !isSticky;

        UnifiedRegex::RegExpTestCache* cache = nullptr;
        JavascriptString * cachedInput = nullptr;
        uint cacheIndex = 0;
        bool cacheHit = false;
        bool cachedResult = false;
        if (useCache)
        {
            cache = pattern->EnsureTestCache();
            cacheIndex = UnifiedRegex::RegexPattern::GetTestCacheIndex(input);
            cachedInput = cache->inputArray[cacheIndex] != nullptr ? cache->inputArray[cacheIndex]->Get() : nullptr;
            cacheHit = cachedInput == input;
        }
#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Test, regularExpression, input);
        UnifiedRegex::RegexPattern::TraceTestCache(cacheHit, input, cachedInput, !useCache);
#endif

        if (cacheHit)
        {
            Assert(useCache);
            cachedResult = (cache->resultBV.Test(cacheIndex) != 0);

            // If our cache says this test should produce a match (which we aren't going to compute),
            // notify the Ctor to invalidate the last match so it must be recomputed before access.
            if (cachedResult)
            {
                InvalidateLastMatchOnCtor(scriptContext, regularExpression, input);
            }

            // for debug builds, let's still do the real test so we can validate values in the cache
#if !DBG
            return JavascriptBoolean::ToVar(cachedResult, scriptContext);
#endif
        }

        CharCount offset;
        if (!GetInitialOffset(isGlobal, isSticky, regularExpression, inputLength, offset))
        {
            if (useCache)
            {
                Assert(offset == 0);
                Assert(!cacheHit || cachedInput == input);
                Assert(!cacheHit || cachedResult == false);
                cache->inputArray[cacheIndex] = regularExpression->GetRecycler()->CreateWeakReferenceHandle(input);
                cache->resultBV.Clear(cacheIndex);
            }
            return scriptContext->GetLibrary()->GetFalse();
        }
        if (offset <= inputLength)
        {
            match = SimpleMatch(scriptContext, pattern, inputStr, inputLength, offset);
        }

        // else: match remains undefined
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, match, match, true, true);
        bool wasFound = !match.IsUndefined();

        if (useCache)
        {
            Assert(offset == 0);
            Assert(!cacheHit || cachedInput == input);
            Assert(!cacheHit || cachedResult == wasFound);
            cache->inputArray[cacheIndex] = regularExpression->GetRecycler()->CreateWeakReferenceHandle(input);
            if (wasFound)
            {
                cache->resultBV.Set(cacheIndex);
            }
            else
            {
                cache->resultBV.Clear(cacheIndex);
            }
        }
        return JavascriptBoolean::ToVar(wasFound, scriptContext);
    }